

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::MatchRepeatedFieldIndices
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,MapKeyComparator *key_comparator,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,vector<int,_std::allocator<int>_> *match_list1,
          vector<int,_std::allocator<int>_> *match_list2)

{
  Reporter *pRVar1;
  int count1_00;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  int32_t iVar5;
  Reflection *pRVar6;
  reference pvVar7;
  size_type __n;
  int *piVar8;
  bool bVar9;
  bool bVar10;
  int local_17c;
  int32_t num_diffs;
  int j;
  int matched_j;
  int iStack_16c;
  bool match;
  int i_1;
  int i;
  int start_offset;
  int match_count;
  bool early_return;
  undefined1 local_138 [8];
  MaximumMatcher matcher;
  anon_class_56_7_95758e85 callback;
  bool success;
  int local_94;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> num_diffs_list1;
  NumDiffsReporter num_diffs_reporter;
  Reporter *reporter;
  value_type_conflict3 local_58;
  byte local_51;
  int local_50;
  int iStack_4c;
  bool is_treated_as_smart_set;
  int count2;
  int count1;
  MapKeyComparator *key_comparator_local;
  FieldDescriptor *repeated_field_local;
  Message *pMStack_30;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  _count2 = key_comparator;
  key_comparator_local = (MapKeyComparator *)repeated_field;
  repeated_field_local._4_4_ = unpacked_any;
  pMStack_30 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  pRVar6 = Message::GetReflection(message1);
  iStack_4c = Reflection::FieldSize(pRVar6,message2_local,(FieldDescriptor *)key_comparator_local);
  pRVar6 = Message::GetReflection(pMStack_30);
  local_50 = Reflection::FieldSize(pRVar6,pMStack_30,(FieldDescriptor *)key_comparator_local);
  local_51 = IsTreatedAsSmartSet(this,(FieldDescriptor *)key_comparator_local);
  local_58 = -1;
  std::vector<int,_std::allocator<int>_>::assign(match_list1,(long)iStack_4c,&local_58);
  reporter._4_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            (match_list2,(long)local_50,(value_type_conflict3 *)((long)&reporter + 4));
  if ((((iStack_4c == 1) && (local_50 == 1)) && (this->reporter_ == (Reporter *)0x0)) &&
     (_count2 == (MapKeyComparator *)0x0)) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list1,0);
    *pvVar7 = 0;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,0);
    *pvVar7 = 0;
    this_local._7_1_ = 1;
    goto LAB_005a7dd0;
  }
  pRVar1 = this->reporter_;
  this->reporter_ = (Reporter *)0x0;
  NumDiffsReporter::NumDiffsReporter
            ((NumDiffsReporter *)
             &num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
  if ((local_51 & 1) != 0) {
    __n = (size_type)iStack_4c;
    local_94 = std::numeric_limits<int>::max();
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)local_90,__n,&local_94);
  }
  count1_00 = iStack_4c;
  iVar3 = local_50;
  bVar9 = true;
  if (this->scope_ == PARTIAL) {
    matcher.match_list2_ = (vector<int,_std::allocator<int>_> *)this;
    std::function<bool(int,int)>::
    function<google::protobuf::util::MessageDifferencer::MatchRepeatedFieldIndices(google::protobuf::Message_const&,google::protobuf::Message_const&,int,google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*,std::vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>const&,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)::__0,void>
              ((function<bool(int,int)> *)&match_count,
               (anon_class_56_7_95758e85 *)&matcher.match_list2_);
    anon_unknown_5::MaximumMatcher::MaximumMatcher
              ((MaximumMatcher *)local_138,count1_00,iVar3,(NodeMatchCallback *)&match_count,
               match_list1,match_list2);
    std::function<bool_(int,_int)>::~function((function<bool_(int,_int)> *)&match_count);
    iVar3 = anon_unknown_5::MaximumMatcher::FindMaximumMatch
                      ((MaximumMatcher *)local_138,pRVar1 == (Reporter *)0x0);
    if ((iVar3 == iStack_4c) || (pRVar1 != (Reporter *)0x0)) {
      bVar9 = iVar3 == iStack_4c;
      bVar2 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    anon_unknown_5::MaximumMatcher::~MaximumMatcher((MaximumMatcher *)local_138);
    if (!bVar2) goto LAB_005a7d3c;
  }
  else {
    i_1 = 0;
    bVar2 = IsTreatedAsSet(this,(FieldDescriptor *)key_comparator_local);
    if (((bVar2) || ((local_51 & 1) != 0)) ||
       (bVar2 = IsTreatedAsSmartList(this,(FieldDescriptor *)key_comparator_local), bVar2)) {
      piVar8 = std::min<int>(&stack0xffffffffffffffb4,&local_50);
      i_1 = *piVar8;
      for (iStack_16c = 0; iStack_16c < iStack_4c && iStack_16c < local_50;
          iStack_16c = iStack_16c + 1) {
        bVar2 = IsMatch(this,(FieldDescriptor *)key_comparator_local,_count2,message2_local,
                        pMStack_30,repeated_field_local._4_4_,parent_fields,(Reporter *)0x0,
                        iStack_16c,iStack_16c);
        if (!bVar2) {
          i_1 = iStack_16c;
          break;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list1,(long)iStack_16c);
        *pvVar7 = iStack_16c;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)iStack_16c);
        *pvVar7 = iStack_16c;
      }
    }
    for (matched_j = i_1; matched_j < iStack_4c; matched_j = matched_j + 1) {
      num_diffs = -1;
      for (local_17c = i_1; local_17c < local_50; local_17c = local_17c + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_17c);
        if (*pvVar7 == -1) {
LAB_005a7976:
          if ((local_51 & 1) == 0) {
            j._3_1_ = IsMatch(this,(FieldDescriptor *)key_comparator_local,_count2,message2_local,
                              pMStack_30,repeated_field_local._4_4_,parent_fields,(Reporter *)0x0,
                              matched_j,local_17c);
          }
          else {
            NumDiffsReporter::Reset
                      ((NumDiffsReporter *)
                       &num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            j._3_1_ = IsMatch(this,(FieldDescriptor *)key_comparator_local,_count2,message2_local,
                              pMStack_30,repeated_field_local._4_4_,parent_fields,
                              (Reporter *)
                              &num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,matched_j,local_17c);
          }
          if ((local_51 & 1) != 0) {
            if (j._3_1_ == false) {
              CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)key_comparator_local);
              if (CVar4 == CPPTYPE_MESSAGE) {
                iVar5 = NumDiffsReporter::GetNumDiffs
                                  ((NumDiffsReporter *)
                                   &num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_90,(long)matched_j);
                if (iVar5 < *pvVar7) {
                  pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_17c);
                  if (*pvVar7 != -1) {
                    pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_17c)
                    ;
                    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)local_90,(long)*pvVar7)
                    ;
                    if (*pvVar7 <= iVar5) goto LAB_005a7b82;
                  }
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)local_90,(long)matched_j)
                  ;
                  *pvVar7 = iVar5;
                  j._3_1_ = true;
                }
              }
            }
            else {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_90,(long)matched_j);
              *pvVar7 = 0;
            }
          }
LAB_005a7b82:
          if ((j._3_1_ != false) &&
             ((num_diffs = local_17c, (local_51 & 1) == 0 ||
              (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_90,(long)matched_j),
              *pvVar7 == 0)))) break;
        }
        else if (((local_51 & 1) != 0) &&
                (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_90,(long)matched_j),
                *pvVar7 != 0)) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)local_17c);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_90,(long)*pvVar7);
          if (*pvVar7 != 0) goto LAB_005a7976;
        }
      }
      bVar2 = num_diffs != -1;
      if (bVar2) {
        if (((local_51 & 1) != 0) &&
           (pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)num_diffs),
           *pvVar7 != -1)) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)num_diffs);
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list1,(long)*pvVar7);
          *pvVar7 = -1;
          bVar2 = false;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list1,(long)matched_j);
        *pvVar7 = num_diffs;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)num_diffs);
        *pvVar7 = matched_j;
      }
      if ((!bVar2) && (pRVar1 == (Reporter *)0x0)) {
        this_local._7_1_ = 0;
        goto LAB_005a7da2;
      }
      bVar10 = bVar9 != false;
      bVar9 = false;
      if (bVar10) {
        bVar9 = bVar2;
      }
    }
LAB_005a7d3c:
    bVar2 = IsTreatedAsSmartList(this,(FieldDescriptor *)key_comparator_local);
    if (bVar2) {
      std::
      function<void_(std::vector<int,_std::allocator<int>_>_*,_std::vector<int,_std::allocator<int>_>_*)>
      ::operator()(&this->match_indices_for_smart_list_callback_,match_list1,match_list2);
    }
    this->reporter_ = pRVar1;
    this_local._7_1_ = bVar9;
  }
LAB_005a7da2:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  NumDiffsReporter::~NumDiffsReporter
            ((NumDiffsReporter *)
             &num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_005a7dd0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageDifferencer::MatchRepeatedFieldIndices(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator,
    const std::vector<SpecificField>& parent_fields,
    std::vector<int>* match_list1, std::vector<int>* match_list2) {
  const int count1 =
      message1.GetReflection()->FieldSize(message1, repeated_field);
  const int count2 =
      message2.GetReflection()->FieldSize(message2, repeated_field);
  const bool is_treated_as_smart_set = IsTreatedAsSmartSet(repeated_field);

  match_list1->assign(count1, -1);
  match_list2->assign(count2, -1);

  // In the special case where both repeated fields have exactly one element,
  // return without calling the comparator.  This optimization prevents the
  // pathological case of deeply nested repeated fields of size 1 from taking
  // exponential-time to compare.
  //
  // In the case where reporter_ is set, we need to do the compare here to
  // properly distinguish a modify from an add+delete.  The code below will not
  // pass the reporter along in recursive calls to nested repeated fields, so
  // the inner call will have the opportunity to perform this optimization and
  // avoid exponential-time behavior.
  //
  // In the case where key_comparator is set, we need to do the compare here to
  // fulfill the interface contract that keys will be compared even if the user
  // asked to ignore that field.  The code will only compare the key fields
  // which (hopefully) do not contain further repeated fields.
  if (count1 == 1 && count2 == 1 && reporter_ == nullptr &&
      key_comparator == nullptr) {
    match_list1->at(0) = 0;
    match_list2->at(0) = 0;
    return true;
  }

  // Ensure that we don't report differences during the matching process. Since
  // field comparators could potentially use this message differencer object to
  // perform further comparisons, turn off reporting here and re-enable it
  // before returning.
  Reporter* reporter = reporter_;
  reporter_ = NULL;
  NumDiffsReporter num_diffs_reporter;
  std::vector<int32_t> num_diffs_list1;
  if (is_treated_as_smart_set) {
    num_diffs_list1.assign(count1, std::numeric_limits<int32_t>::max());
  }

  bool success = true;
  // Find potential match if this is a special repeated field.
  if (scope_ == PARTIAL) {
    // When partial matching is enabled, Compare(a, b) && Compare(a, c)
    // doesn't necessarily imply Compare(b, c). Therefore a naive greedy
    // algorithm will fail to find a maximum matching.
    // Here we use the augmenting path algorithm.
    auto callback = [&](int i1, int i2) {
      return IsMatch(repeated_field, key_comparator, &message1, &message2,
                     unpacked_any, parent_fields, nullptr, i1, i2);
    };
    MaximumMatcher matcher(count1, count2, std::move(callback), match_list1,
                           match_list2);
    // If diff info is not needed, we should end the matching process as
    // soon as possible if not all items can be matched.
    bool early_return = (reporter == nullptr);
    int match_count = matcher.FindMaximumMatch(early_return);
    if (match_count != count1 && early_return) return false;
    success = success && (match_count == count1);
  } else {
    int start_offset = 0;
    // If the two repeated fields are treated as sets, optimize for the case
    // where both start with same items stored in the same order.
    if (IsTreatedAsSet(repeated_field) || is_treated_as_smart_set ||
        IsTreatedAsSmartList(repeated_field)) {
      start_offset = std::min(count1, count2);
      for (int i = 0; i < count1 && i < count2; i++) {
        if (IsMatch(repeated_field, key_comparator, &message1, &message2,
                    unpacked_any, parent_fields, nullptr, i, i)) {
          match_list1->at(i) = i;
          match_list2->at(i) = i;
        } else {
          start_offset = i;
          break;
        }
      }
    }
    for (int i = start_offset; i < count1; ++i) {
      // Indicates any matched elements for this repeated field.
      bool match = false;
      int matched_j = -1;

      for (int j = start_offset; j < count2; j++) {
        if (match_list2->at(j) != -1) {
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0 ||
              num_diffs_list1[match_list2->at(j)] == 0) {
            continue;
          }
        }

        if (is_treated_as_smart_set) {
          num_diffs_reporter.Reset();
          match =
              IsMatch(repeated_field, key_comparator, &message1, &message2,
                      unpacked_any, parent_fields, &num_diffs_reporter, i, j);
        } else {
          match = IsMatch(repeated_field, key_comparator, &message1, &message2,
                          unpacked_any, parent_fields, nullptr, i, j);
        }

        if (is_treated_as_smart_set) {
          if (match) {
            num_diffs_list1[i] = 0;
          } else if (repeated_field->cpp_type() ==
                     FieldDescriptor::CPPTYPE_MESSAGE) {
            // Replace with the one with fewer diffs.
            const int32_t num_diffs = num_diffs_reporter.GetNumDiffs();
            if (num_diffs < num_diffs_list1[i]) {
              // If j has been already matched to some element, ensure the
              // current num_diffs is smaller.
              if (match_list2->at(j) == -1 ||
                  num_diffs < num_diffs_list1[match_list2->at(j)]) {
                num_diffs_list1[i] = num_diffs;
                match = true;
              }
            }
          }
        }

        if (match) {
          matched_j = j;
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0) {
            break;
          }
        }
      }

      match = (matched_j != -1);
      if (match) {
        if (is_treated_as_smart_set && match_list2->at(matched_j) != -1) {
          // This is to revert the previously matched index in list2.
          match_list1->at(match_list2->at(matched_j)) = -1;
          match = false;
        }
        match_list1->at(i) = matched_j;
        match_list2->at(matched_j) = i;
      }
      if (!match && reporter == nullptr) return false;
      success = success && match;
    }
  }

  if (IsTreatedAsSmartList(repeated_field)) {
    match_indices_for_smart_list_callback_(match_list1, match_list2);
  }

  reporter_ = reporter;

  return success;
}